

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_armlet_skip.hpp
# Opt level: O3

void __thiscall PatchFixArmletSkip::alter_world(PatchFixArmletSkip *this,World *world)

{
  pointer ppEVar1;
  mapped_type *ppMVar2;
  key_type local_2;
  
  ppMVar2 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,&local_2);
  ppEVar1 = ((*ppMVar2)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (9 < (ulong)((long)((*ppMVar2)->_entities).
                        super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3)) {
    (ppEVar1[9]->_attrs).can_pass_through = true;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",9);
}

Assistant:

void alter_world(World& world) override
    {
        // Make Mir Tower magic barrier non-colliding
        world.map(MAP_MIR_TOWER_EXTERIOR)->entity(9)->can_pass_through(true);
    }